

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

Transaction *
cfd::core::Psbt::RebuildTransaction(Transaction *__return_storage_ptr__,void *wally_psbt_pointer)

{
  Transaction *this;
  ByteData local_80;
  Transaction local_68;
  void *local_28;
  wally_psbt *psbt_pointer;
  void *local_18;
  void *wally_psbt_pointer_local;
  Transaction *tx;
  
  psbt_pointer._7_1_ = 0;
  this = __return_storage_ptr__;
  local_18 = wally_psbt_pointer;
  wally_psbt_pointer_local = __return_storage_ptr__;
  Transaction::Transaction(__return_storage_ptr__);
  if ((local_18 != (void *)0x0) && (local_28 = local_18, *(long *)((long)local_18 + 8) != 0)) {
    ConvertBitcoinTxFromWally(&local_80,*(wally_tx **)((long)local_18 + 8),false);
    Transaction::Transaction(&local_68,&local_80);
    Transaction::operator=(this,&local_68);
    Transaction::~Transaction(this);
    ByteData::~ByteData((ByteData *)0x46d037);
  }
  return __return_storage_ptr__;
}

Assistant:

Transaction Psbt::RebuildTransaction(const void *wally_psbt_pointer) {
  Transaction tx;
  if (wally_psbt_pointer != nullptr) {
    const struct wally_psbt *psbt_pointer;
    psbt_pointer = static_cast<const struct wally_psbt *>(wally_psbt_pointer);
    if (psbt_pointer->tx != nullptr) {
      tx = Transaction(ConvertBitcoinTxFromWally(psbt_pointer->tx, false));
    }
  }
  return tx;
}